

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocket.h
# Opt level: O2

void __thiscall
uWS::WebSocket<true,_true>::end(WebSocket<true,_true> *this,int code,string_view message)

{
  _List_base<uWS::Topic_*,_std::allocator<uWS::Topic_*>_> *this_00;
  ushort uVar1;
  bool bVar2;
  long lVar3;
  ssize_t sVar4;
  undefined8 uVar5;
  long lVar6;
  char *__src;
  int __how;
  ulong uVar7;
  int __fd;
  size_t __n;
  function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_(uWS::WebSocket<true,_true>_*,_int,_std::basic_string_view<char,_std::char_traits<char>_>)>_>
  *parent;
  char closePayload [125];
  
  __src = message._M_str;
  uVar7 = message._M_len;
  uVar1 = (ushort)code;
  lVar3 = us_socket_ext(1,this);
  if (*(char *)(lVar3 + 0x5c) == '\0') {
    *(undefined1 *)(lVar3 + 0x5c) = 1;
    __n = 0x7b;
    if (uVar7 < 0x7b) {
      __n = uVar7;
    }
    if (uVar1 == 0) {
      __fd = 0;
    }
    else {
      closePayload._0_2_ = uVar1 << 8 | uVar1 >> 8;
      if (__src != (char *)0x0) {
        memcpy(closePayload + 2,__src,__n);
      }
      __fd = (int)__n + 2;
    }
    sVar4 = send(this,__fd,closePayload,8,0);
    bVar2 = AsyncSocket<true>::isCorked((AsyncSocket<true> *)this);
    if ((!bVar2) && ((char)sVar4 != '\0')) {
      AsyncSocket<true>::shutdown((AsyncSocket<true> *)this,__fd,__how);
    }
    uVar5 = us_socket_context(1,this);
    lVar6 = us_socket_context_ext(1,uVar5);
    bVar2 = fu2::abi_400::detail::function::operator_cast_to_bool((function *)(lVar6 + 0x40));
    if (bVar2) {
      (**(code **)(lVar6 + 0x58))((function *)(lVar6 + 0x40),0x10,this,code,uVar7,__src);
    }
    TopicTree::unsubscribeAll((TopicTree *)(lVar6 + 0xb8),*(Subscriber **)(lVar3 + 0x68));
    this_00 = *(_List_base<uWS::Topic_*,_std::allocator<uWS::Topic_*>_> **)(lVar3 + 0x68);
    if (this_00 != (_List_base<uWS::Topic_*,_std::allocator<uWS::Topic_*>_> *)0x0) {
      std::__cxx11::_List_base<uWS::Topic_*,_std::allocator<uWS::Topic_*>_>::_M_clear(this_00);
    }
    operator_delete(this_00,0x20);
    *(undefined8 *)(lVar3 + 0x68) = 0;
  }
  return;
}

Assistant:

void end(int code, std::string_view message = {}) {
        /* Check if we already called this one */
        WebSocketData *webSocketData = (WebSocketData *) us_socket_ext(SSL, (us_socket_t *) this);
        if (webSocketData->isShuttingDown) {
            return;
        }

        /* We postpone any FIN sending to either drainage or uncorking */
        webSocketData->isShuttingDown = true;

        /* Format and send the close frame */
        static const int MAX_CLOSE_PAYLOAD = 123;
        int length = (int) std::min<size_t>(MAX_CLOSE_PAYLOAD, message.length());
        char closePayload[MAX_CLOSE_PAYLOAD + 2];
        int closePayloadLength = (int) protocol::formatClosePayload(closePayload, (uint16_t) code, message.data(), length);
        bool ok = send(std::string_view(closePayload, closePayloadLength), OpCode::CLOSE);

        /* FIN if we are ok and not corked */
        WebSocket<SSL, true> *webSocket = (WebSocket<SSL, true> *) this;
        if (!webSocket->isCorked()) {
            if (ok) {
                /* If we are not corked, and we just sent off everything, we need to FIN right here.
                 * In all other cases, we need to fin either if uncork was successful, or when drainage is complete. */
                webSocket->shutdown();
            }
        }

        /* Emit close event */
        WebSocketContextData<SSL> *webSocketContextData = (WebSocketContextData<SSL> *) us_socket_context_ext(SSL,
            (us_socket_context_t *) us_socket_context(SSL, (us_socket_t *) this)
        );
        if (webSocketContextData->closeHandler) {
            webSocketContextData->closeHandler(this, code, message);
        }

        /* Make sure to unsubscribe from any pub/sub node at exit */
        webSocketContextData->topicTree.unsubscribeAll(webSocketData->subscriber);
        delete webSocketData->subscriber;
        webSocketData->subscriber = nullptr;
    }